

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a64assembler.cpp
# Opt level: O0

bool asmjit::v1_14::a64::encodeLMH(uint32_t sizeField,uint32_t elementIndex,LMHImm *out)

{
  byte bVar1;
  uint32_t maxElementIndex;
  uint32_t lmShift;
  uint32_t hShift;
  LMHImm *out_local;
  uint32_t elementIndex_local;
  uint32_t sizeField_local;
  bool local_1;
  
  if ((sizeField == 1) || (sizeField == 2)) {
    bVar1 = (byte)sizeField;
    out->h = elementIndex >> (3 - bVar1 & 0x1f);
    out->lm = elementIndex << (bVar1 - 1 & 0x1f) & 3;
    out->maxRmId = (8 << (bVar1 & 0x1f)) - 1;
    local_1 = elementIndex <= 0xfU >> (bVar1 & 0x1f);
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

static inline bool encodeLMH(uint32_t sizeField, uint32_t elementIndex, LMHImm* out) noexcept {
  if (sizeField != 1 && sizeField != 2)
    return false;

  uint32_t hShift = 3u - sizeField;
  uint32_t lmShift = sizeField - 1u;
  uint32_t maxElementIndex = 15u >> sizeField;

  out->h = elementIndex >> hShift;
  out->lm = (elementIndex << lmShift) & 0x3u;
  out->maxRmId = (8u << sizeField) - 1;

  return elementIndex <= maxElementIndex;
}